

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O3

ImPlotTick * __thiscall
ImPlotTickCollection::Append
          (ImPlotTickCollection *this,double value,bool major,bool show_label,char *fmt)

{
  int iVar1;
  size_t sVar2;
  ImPlotTick *pIVar3;
  int iVar4;
  char temp [32];
  ImPlotTick local_68;
  char local_48;
  char acStack_47 [39];
  
  local_68.LabelSize.x = 0.0;
  local_68.LabelSize.y = 0.0;
  local_68.TextOffset = -1;
  local_68.Level = 0;
  local_68.PlotPos = value;
  local_68.Major = major;
  local_68.ShowLabel = show_label;
  if (fmt != (char *)0x0 && show_label) {
    iVar1 = (this->TextBuffer).Buf.Size;
    iVar4 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    local_68.TextOffset = iVar4;
    snprintf(&local_48,0x20,fmt);
    sVar2 = strlen(&local_48);
    ImGuiTextBuffer::append(&this->TextBuffer,&local_48,acStack_47 + sVar2);
    local_68.LabelSize =
         ImGui::CalcTextSize((this->TextBuffer).Buf.Data + iVar4,(char *)0x0,false,-1.0);
  }
  pIVar3 = Append(this,&local_68);
  return pIVar3;
}

Assistant:

const ImPlotTick& Append(double value, bool major, bool show_label, const char* fmt) {
        ImPlotTick tick(value, major, show_label);
        if (show_label && fmt != NULL) {
            char temp[32];
            tick.TextOffset = TextBuffer.size();
            snprintf(temp, 32, fmt, tick.PlotPos);
            TextBuffer.append(temp, temp + strlen(temp) + 1);
            tick.LabelSize = ImGui::CalcTextSize(TextBuffer.Buf.Data + tick.TextOffset);
        }
        return Append(tick);
    }